

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

iterator * __thiscall Catch::clara::TextFlow::Column::iterator::operator++(iterator *this)

{
  char cVar1;
  pointer pbVar2;
  ulong uVar3;
  long lVar4;
  pointer pbVar5;
  undefined1 *this_00;
  
  uVar3 = this->m_pos + this->m_len;
  this->m_pos = uVar3;
  pbVar5 = (this->m_column->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar3 < *(size_type *)((long)(pbVar5 + this->m_stringIndex) + 8)) &&
     (*(char *)(*(long *)&pbVar5[this->m_stringIndex]._M_dataplus + uVar3) == '\n')) {
    this->m_pos = uVar3 + 1;
  }
  else {
    uVar3 = this->m_pos;
    pbVar5 = (this->m_column->m_strings).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar3 < *(size_type *)((long)(pbVar5 + this->m_stringIndex) + 8)) {
      pbVar5 = pbVar5 + this->m_stringIndex;
      this_00 = (undefined1 *)this;
      do {
        cVar1 = *(char *)(*(long *)&pbVar5->_M_dataplus + uVar3);
        if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
          operator++((iterator *)this_00);
        }
        this_00 = isWhitespace(char)::chars_abi_cxx11_;
        lVar4 = ::std::__cxx11::string::find(-0x38,(ulong)(uint)(int)cVar1);
        if (lVar4 == -1) break;
        uVar3 = this->m_pos + 1;
        this->m_pos = uVar3;
        pbVar2 = (this->m_column->m_strings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = pbVar2 + this->m_stringIndex;
      } while (uVar3 < *(size_type *)((long)(pbVar2 + this->m_stringIndex) + 8));
    }
  }
  pbVar5 = (this->m_column->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (this->m_pos == *(size_type *)((long)(pbVar5 + this->m_stringIndex) + 8)) {
    this->m_pos = 0;
    this->m_stringIndex = this->m_stringIndex + 1;
  }
  if (this->m_stringIndex <
      (ulong)((long)(this->m_column->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5)) {
    calcLength(this);
  }
  return this;
}

Assistant:

auto operator ++() -> iterator& {
			m_pos += m_len;
			if (m_pos < line().size() && line()[m_pos] == '\n')
				m_pos += 1;
			else
				while (m_pos < line().size() && isWhitespace(line()[m_pos]))
					++m_pos;

			if (m_pos == line().size()) {
				m_pos = 0;
				++m_stringIndex;
			}
			if (m_stringIndex < m_column.m_strings.size())
				calcLength();
			return *this;
		}